

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O0

void ymf278b_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  YMF278BChip *chip;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *info_local;
  
  if (offset <= *(uint *)((long)info + 0x568)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)info + 0x568) < offset + length) {
      data_local._0_4_ = *(int *)((long)info + 0x568) - offset;
    }
    memcpy((void *)(*(long *)((long)info + 0x570) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void ymf278b_write_rom(void *info, UINT32 offset, UINT32 length, const UINT8* data)
{
	YMF278BChip *chip = (YMF278BChip *)info;
	
	if (offset > chip->ROMSize)
		return;
	if (offset + length > chip->ROMSize)
		length = chip->ROMSize - offset;
	
	memcpy(chip->rom + offset, data, length);
	
	return;
}